

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O3

void ws_read_cb(void *arg)

{
  nni_mtx *mtx;
  nni_aio *aio;
  byte bVar1;
  ws_frame *frame;
  ushort uVar2;
  nng_err nVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  void *pvVar7;
  ws_frame *pwVar8;
  uint16_t uVar9;
  uint uVar10;
  undefined1 local_48 [8];
  nni_iov iov;
  
  mtx = (nni_mtx *)((long)arg + 0x60);
  nni_mtx_lock(mtx);
  frame = *(ws_frame **)((long)arg + 0xf0);
  if (frame == (ws_frame *)0x0) goto LAB_0012a470;
  aio = (nni_aio *)((long)arg + 0x2c0);
  nVar3 = nni_aio_result(aio);
  if (nVar3 != NNG_OK) {
    *(undefined1 *)((long)arg + 0x51) = 1;
    uVar9 = 0;
LAB_0012a46b:
    ws_close((nni_ws *)arg,uVar9);
    goto LAB_0012a470;
  }
  if (frame->hlen == 0) {
    frame->hlen = 2;
    frame->op = frame->head[0] & 0x7f;
    frame->final = (_Bool)(frame->head[0] >> 7);
    bVar1 = frame->head[1];
    frame->masked = (_Bool)(bVar1 >> 7);
    sVar6 = 2;
    if ((char)bVar1 < '\0') {
      frame->hlen = 6;
      sVar6 = 6;
    }
    if ((bVar1 & 0x7f) == 0x7e) {
      sVar6 = sVar6 + 2;
LAB_0012a635:
      frame->hlen = sVar6;
    }
    else {
      if ((bVar1 & 0x7f) == 0x7f) {
        sVar6 = sVar6 | 8;
        goto LAB_0012a635;
      }
      if (-1 < (char)bVar1) goto LAB_0012a494;
    }
    local_48 = (undefined1  [8])(frame->head + 2);
    iov.iov_buf = (void *)(sVar6 - 2);
LAB_0012a64f:
    nni_aio_set_iov(aio,1,(nni_iov *)local_48);
    nni_http_read_full(*(nni_http_conn **)((long)arg + 0x9e8),aio);
LAB_0012a66b:
    nni_mtx_unlock(mtx);
    return;
  }
LAB_0012a494:
  if (frame->buf == (uint8_t *)0x0) {
    uVar10 = frame->head[1] & 0x7f;
    uVar5 = (ulong)uVar10;
    frame->len = uVar5;
    if (uVar5 == 0x7e) {
      uVar2 = *(ushort *)(frame->head + 2) << 8 | *(ushort *)(frame->head + 2) >> 8;
      uVar5 = (ulong)uVar2;
      frame->len = uVar5;
      if (0x7d < uVar2) goto LAB_0012a6ab;
      goto LAB_0012a849;
    }
    if (uVar10 == 0x7f) {
      uVar5 = (ulong)frame->head[9] +
              ((ulong)frame->head[8] << 8 |
              (ulong)frame->head[7] << 0x10 |
              (ulong)frame->head[6] << 0x18 |
              (ulong)frame->head[5] << 0x20 |
              (ulong)frame->head[4] << 0x28 |
              (ulong)frame->head[3] << 0x30 | (ulong)frame->head[2] << 0x38);
      frame->len = uVar5;
      if (uVar5 < 0x10000) goto LAB_0012a849;
    }
LAB_0012a6ab:
    if (*(ulong *)((long)arg + 0x9f0) != 0 && *(ulong *)((long)arg + 0x9f0) < uVar5) {
LAB_0012a81a:
      uVar9 = 0x3f1;
      goto LAB_0012a46b;
    }
    if ((*(char *)((long)arg + 0x55) == '\0') && (*(long *)((long)arg + 0xa00) != 0)) {
      iov.iov_len = (long)arg + 0xd0;
      for (pvVar7 = nni_list_first((nni_list *)iov.iov_len); pvVar7 != (void *)0x0;
          pvVar7 = nni_list_next((nni_list *)iov.iov_len,pvVar7)) {
        uVar5 = uVar5 + *(long *)((long)pvVar7 + 0xa8);
      }
      if (*(ulong *)((long)arg + 0xa00) < uVar5) goto LAB_0012a81a;
    }
    bVar1 = frame->masked;
    if ((_Bool)bVar1 == true) {
      *(undefined4 *)frame->mask = *(undefined4 *)(frame->head + (frame->hlen - 4));
      if (*(char *)((long)arg + 0x50) == '\0') {
LAB_0012a849:
        uVar9 = 0x3ea;
        goto LAB_0012a46b;
      }
    }
    else if (*(char *)((long)arg + 0x50) == '\x01') goto LAB_0012a849;
    pvVar7 = (void *)frame->len;
    if (pvVar7 != (void *)0x0) {
      if (pvVar7 < (void *)0x7e) {
        frame->buf = frame->sdata;
        frame->asize = 0;
        local_48 = (undefined1  [8])frame->sdata;
        iov.iov_buf = pvVar7;
      }
      else {
        pwVar8 = (ws_frame *)nni_alloc((size_t)pvVar7);
        frame->adata = (uint8_t *)pwVar8;
        if (pwVar8 == (ws_frame *)0x0) {
          ws_close((nni_ws *)arg,0x3f3);
          goto LAB_0012a66b;
        }
        iov.iov_buf = (void *)frame->len;
        frame->asize = (size_t)iov.iov_buf;
        frame->buf = (uint8_t *)pwVar8;
        local_48 = (undefined1  [8])pwVar8;
      }
      goto LAB_0012a64f;
    }
  }
  else {
    bVar1 = frame->masked;
  }
  if ((bVar1 & 1) != 0) {
    if (frame->len != 0) {
      uVar5 = 0;
      do {
        frame->buf[uVar5] = frame->buf[uVar5] ^ frame->mask[(uint)uVar5 & 3];
        uVar5 = uVar5 + 1;
      } while (uVar5 < frame->len);
    }
    frame->hlen = frame->hlen - 4;
    frame->head[1] = frame->head[1] & 0x7f;
    frame->masked = false;
  }
  switch(frame->op) {
  case WS_CONT:
    if (*(char *)((long)arg + 0x56) == '\0') goto switchD_0012a50d_caseD_3;
    if (frame->final == true) {
      *(undefined1 *)((long)arg + 0x56) = 0;
    }
    goto LAB_0012a737;
  case WS_TEXT:
    if (*(char *)((long)arg + 0x58) == '\0') {
      ws_close((nni_ws *)arg,0x3eb);
    }
  case WS_BINARY:
    if (*(char *)((long)arg + 0x56) == '\x01') goto switchD_0012a50d_caseD_3;
    if (frame->final == false) {
      *(undefined1 *)((long)arg + 0x56) = 1;
    }
LAB_0012a737:
    *(undefined8 *)((long)arg + 0xf0) = 0;
    nni_list_append((nni_list *)((long)arg + 0xd0),frame);
LAB_0012a7fc:
    ws_read_finish((nni_ws *)arg);
    break;
  case WS_CLOSE:
    *(undefined1 *)((long)arg + 0x52) = 1;
    if (*(char *)((long)arg + 0x51) == '\0') {
      uVar9 = 1000;
      goto LAB_0012a79d;
    }
    *(undefined1 *)((long)arg + 0x54) = 0;
    nni_aio_finish((nni_aio *)((long)arg + 0x488),NNG_OK,0);
    break;
  case WS_PING:
    if (0x7d < frame->len) goto switchD_0012a50d_caseD_3;
    if ((*(char *)((long)arg + 0x51) == '\0') &&
       (iVar4 = ws_msg_init_control((ws_frame **)local_48,(nni_ws *)arg,'\n',frame->buf,frame->len),
       iVar4 == 0)) {
      nni_list_prepend((nni_list *)((long)arg + 0xb8),(void *)local_48);
      ws_start_write((nni_ws *)arg);
    }
LAB_0012a7e9:
    *(undefined8 *)((long)arg + 0xf0) = 0;
    ws_frame_fini(frame);
    goto LAB_0012a7fc;
  case WS_PONG:
    if (frame->len < 0x7e) goto LAB_0012a7e9;
  default:
switchD_0012a50d_caseD_3:
    uVar9 = 0x3ea;
LAB_0012a79d:
    ws_close((nni_ws *)arg,uVar9);
  }
  ws_start_read((nni_ws *)arg);
LAB_0012a470:
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

static void
ws_read_cb(void *arg)
{
	nni_ws   *ws  = arg;
	nni_aio  *aio = &ws->rxaio;
	ws_frame *frame;

	nni_mtx_lock(&ws->mtx);
	if ((frame = ws->rxframe) == NULL) {
		nni_mtx_unlock(&ws->mtx); // canceled during close
		return;
	}

	if (nni_aio_result(aio) != 0) {
		// on a read error, we assume the connection was
		// abruptly closed, and we don't try to shut down nicely
		ws->closed = true;
		ws_close(ws, 0);
		nni_mtx_unlock(&ws->mtx);
		return;
	}

	if (frame->hlen == 0) {
		frame->hlen   = 2;
		frame->op     = frame->head[0] & 0x7fu;
		frame->final  = (frame->head[0] & 0x80u) ? 1 : 0;
		frame->masked = (frame->head[1] & 0x80u) ? 1 : 0;
		if (frame->masked) {
			frame->hlen += 4;
		}
		if ((frame->head[1] & 0x7Fu) == 127) {
			frame->hlen += 8;
		} else if ((frame->head[1] & 0x7Fu) == 126) {
			frame->hlen += 2;
		}

		// If we didn't read the full header yet, then read
		// the rest of it.
		if (frame->hlen != 2) {
			nni_iov iov;
			iov.iov_buf = frame->head + 2;
			iov.iov_len = frame->hlen - 2;
			nni_aio_set_iov(aio, 1, &iov);
			nni_http_read_full(ws->http, aio);
			nni_mtx_unlock(&ws->mtx);
			return;
		}
	}

	// If we are returning from a read of additional data, then
	// the buf will be set.  Otherwise, we need to determine
	// how much data to read.  As our headers are complete, we take
	// this time to do some protocol checks -- no point in waiting
	// to read data.  (Frame size check needs to be done first
	// anyway to prevent DoS.)

	if (frame->buf == NULL) {

		// Determine expected frame size.
		switch ((frame->len = (frame->head[1] & 0x7Fu))) {
		case 127:
			NNI_GET64(frame->head + 2, frame->len);
			if (frame->len < 65536) {
				ws_close(ws, WS_CLOSE_PROTOCOL_ERR);
				nni_mtx_unlock(&ws->mtx);
				return;
			}
			break;
		case 126:
			NNI_GET16(frame->head + 2, frame->len);
			if (frame->len < 126) {
				ws_close(ws, WS_CLOSE_PROTOCOL_ERR);
				nni_mtx_unlock(&ws->mtx);
				return;
			}

			break;
		}

		if ((frame->len > ws->maxframe) && (ws->maxframe > 0)) {
			ws_close(ws, WS_CLOSE_TOO_BIG);
			nni_mtx_unlock(&ws->mtx);
			return;
		}
		// For message mode, also check to make sure that the overall
		// length of the message has not exceeded our recvmax.
		// (Protect against an infinite stream of small messages!)
		if ((!ws->isstream) && (ws->recvmax > 0)) {
			size_t    totlen = frame->len;
			ws_frame *fr2;
			NNI_LIST_FOREACH (&ws->rxq, fr2) {
				totlen += fr2->len;
			}
			if (totlen > ws->recvmax) {
				ws_close(ws, WS_CLOSE_TOO_BIG);
				nni_mtx_unlock(&ws->mtx);
				return;
			}
		}

		// Check for masking.  (We don't actually unmask
		// here, because we don't have data yet.)
		if (frame->masked) {
			memcpy(frame->mask, frame->head + frame->hlen - 4, 4);
			if (!ws->server) {
				ws_close(ws, WS_CLOSE_PROTOCOL_ERR);
				nni_mtx_unlock(&ws->mtx);
				return;
			}
		} else if (ws->server) {
			ws_close(ws, WS_CLOSE_PROTOCOL_ERR);
			nni_mtx_unlock(&ws->mtx);
			return;
		}

		// If we expected data, then ask for it.
		if (frame->len != 0) {

			nni_iov iov;

			// Short frames can avoid an alloc
			if (frame->len < 126) {
				frame->buf   = frame->sdata;
				frame->asize = 0;
			} else {
				frame->adata = nni_alloc(frame->len);
				if (frame->adata == NULL) {
					ws_close(ws, WS_CLOSE_INTERNAL);
					nni_mtx_unlock(&ws->mtx);
					return;
				}
				frame->asize = frame->len;
				frame->buf   = frame->adata;
			}

			iov.iov_buf = frame->buf;
			iov.iov_len = frame->len;
			nni_aio_set_iov(aio, 1, &iov);
			nni_http_read_full(ws->http, aio);
			nni_mtx_unlock(&ws->mtx);
			return;
		}
	}

	// At this point, we have a complete frame.
	ws_unmask_frame(frame); // idempotent

	ws_read_frame_cb(ws, frame);
	ws_start_read(ws);
	nni_mtx_unlock(&ws->mtx);
}